

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       set_caster<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,unsigned_int>
       ::
       cast<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&>
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  __node_base *p_Var2;
  handle hVar3;
  set s;
  object value_;
  handle local_28;
  handle local_20;
  
  set::set((set *)&local_28);
  p_Var2 = &(src->_M_h)._M_before_begin;
  do {
    hVar3.m_ptr = local_28.m_ptr;
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      local_28.m_ptr = (PyObject *)0x0;
LAB_001ed354:
      object::~object((object *)&local_28);
      return (handle)hVar3.m_ptr;
    }
    local_20.m_ptr = (PyObject *)PyLong_FromSize_t((int)*(size_type *)(p_Var2 + 1));
    if (local_20.m_ptr == (PyObject *)0x0) {
LAB_001ed33d:
      object::~object((object *)&local_20);
      hVar3.m_ptr = (PyObject *)0x0;
      goto LAB_001ed354;
    }
    bVar1 = set::add<pybind11::object&>((set *)&local_28,(object *)&local_20);
    if (!bVar1) goto LAB_001ed33d;
    object::~object((object *)&local_20);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }